

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void selectAddSubqueryTypeInfo(Walker *pWalker,Select *p)

{
  SrcList *pSVar1;
  Parse *pParse;
  int iVar2;
  int iVar3;
  Select **ppSVar4;
  
  if (-1 < (char)p->selFlags) {
    p->selFlags = p->selFlags | 0x80;
    pSVar1 = p->pSrc;
    iVar2 = pSVar1->nSrc;
    if (0 < iVar2) {
      pParse = pWalker->pParse;
      ppSVar4 = &pSVar1->a[0].pSelect;
      iVar3 = 0;
      do {
        if (((((Table *)ppSVar4[-1])->tabFlags & 0x4000) != 0) && (*ppSVar4 != (Select *)0x0)) {
          sqlite3SubqueryColumnTypes(pParse,(Table *)ppSVar4[-1],*ppSVar4,'@');
          iVar2 = pSVar1->nSrc;
        }
        iVar3 = iVar3 + 1;
        ppSVar4 = ppSVar4 + 0xd;
      } while (iVar3 < iVar2);
    }
  }
  return;
}

Assistant:

static void selectAddSubqueryTypeInfo(Walker *pWalker, Select *p){
  Parse *pParse;
  int i;
  SrcList *pTabList;
  SrcItem *pFrom;

  if( p->selFlags & SF_HasTypeInfo ) return;
  p->selFlags |= SF_HasTypeInfo;
  pParse = pWalker->pParse;
  assert( (p->selFlags & SF_Resolved) );
  pTabList = p->pSrc;
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab = pFrom->pTab;
    assert( pTab!=0 );
    if( (pTab->tabFlags & TF_Ephemeral)!=0 ){
      /* A sub-query in the FROM clause of a SELECT */
      Select *pSel = pFrom->pSelect;
      if( pSel ){
        sqlite3SubqueryColumnTypes(pParse, pTab, pSel, SQLITE_AFF_NONE);
      }
    }
  }
}